

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O3

uint32_t __thiscall
embree::OBJLoader::getVertex
          (OBJLoader *this,
          map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
          *vertexMap,Ref<embree::SceneGraph::TriangleMeshNode> *mesh,Vertex *i)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Vec3fa *pVVar3;
  TriangleMeshNode *pTVar4;
  pointer pVVar5;
  undefined8 uVar6;
  iterator iVar7;
  Vec3fa *pVVar8;
  long lVar9;
  pointer pVVar10;
  mapped_type *pmVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint32_t uVar15;
  ulong uVar16;
  ulong uVar17;
  pointer pvVar18;
  size_t sVar19;
  size_t *psVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  iVar7 = std::
          _Rb_tree<embree::Vertex,_std::pair<const_embree::Vertex,_unsigned_int>,_std::_Select1st<std::pair<const_embree::Vertex,_unsigned_int>_>,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
          ::find(&vertexMap->_M_t,i);
  if ((_Rb_tree_header *)iVar7._M_node == &(vertexMap->_M_t)._M_impl.super__Rb_tree_header) {
    if ((ulong)i->v < (this->v).size_active) {
      pvVar18 = (mesh->ptr->positions).
                super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar3 = (this->v).items + i->v;
      fVar21 = (pVVar3->field_0).m128[0];
      fVar22 = (pVVar3->field_0).m128[1];
      fVar23 = (pVVar3->field_0).m128[2];
      fVar24 = (pVVar3->field_0).m128[3];
      sVar19 = pvVar18->size_active;
      uVar13 = pvVar18->size_alloced;
      uVar14 = sVar19 + 1;
      if (uVar13 < uVar14) {
        uVar17 = uVar14;
        uVar16 = uVar13;
        if (uVar13 != 0) {
          do {
            uVar17 = uVar16 * 2 + (ulong)(uVar16 * 2 == 0);
            uVar16 = uVar17;
          } while (uVar17 < uVar14);
        }
        if (uVar13 != uVar17) {
          pVVar3 = pvVar18->items;
          local_48 = fVar21;
          fStack_44 = fVar22;
          fStack_40 = fVar23;
          fStack_3c = fVar24;
          pVVar8 = (Vec3fa *)alignedMalloc(uVar17 << 4,0x10);
          pvVar18->items = pVVar8;
          if (pvVar18->size_active != 0) {
            lVar9 = 0;
            uVar13 = 0;
            do {
              puVar2 = (undefined8 *)((long)&pVVar3->field_0 + lVar9);
              uVar6 = puVar2[1];
              puVar1 = (undefined8 *)((long)&pvVar18->items->field_0 + lVar9);
              *puVar1 = *puVar2;
              puVar1[1] = uVar6;
              uVar13 = uVar13 + 1;
              lVar9 = lVar9 + 0x10;
            } while (uVar13 < pvVar18->size_active);
          }
          alignedFree(pVVar3);
          pvVar18->size_alloced = uVar17;
          fVar21 = local_48;
          fVar22 = fStack_44;
          fVar23 = fStack_40;
          fVar24 = fStack_3c;
        }
      }
      pvVar18->size_active = uVar14;
      pVVar3 = pvVar18->items + sVar19;
      (pVVar3->field_0).m128[0] = fVar21;
      (pVVar3->field_0).m128[1] = fVar22;
      (pVVar3->field_0).m128[2] = fVar23;
      (pVVar3->field_0).m128[3] = fVar24;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"WARNING: corrupted OBJ file",0x1b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
    }
    uVar12 = i->vn;
    if (uVar12 != 0xffffffff) {
      pvVar18 = (mesh->ptr->normals).
                super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar19 = pvVar18->size_active;
      uVar14 = ((mesh->ptr->positions).
                super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->size_active;
      if (sVar19 < uVar14) {
        do {
          psVar20 = &pvVar18->size_active;
          uVar14 = pvVar18->size_alloced;
          if (uVar14 <= sVar19) {
            uVar13 = uVar14;
            if (uVar14 == 0) {
              uVar13 = sVar19 + 1;
            }
            else {
              do {
                uVar13 = uVar13 * 2 + (ulong)(uVar13 * 2 == 0);
              } while (uVar13 <= sVar19);
            }
            if (uVar14 != uVar13) {
              pVVar3 = pvVar18->items;
              pVVar8 = (Vec3fa *)alignedMalloc(uVar13 << 4,0x10);
              pvVar18->items = pVVar8;
              if (*psVar20 != 0) {
                lVar9 = 0;
                uVar14 = 0;
                do {
                  puVar2 = (undefined8 *)((long)&pVVar3->field_0 + lVar9);
                  uVar6 = puVar2[1];
                  puVar1 = (undefined8 *)((long)&pvVar18->items->field_0 + lVar9);
                  *puVar1 = *puVar2;
                  puVar1[1] = uVar6;
                  uVar14 = uVar14 + 1;
                  lVar9 = lVar9 + 0x10;
                } while (uVar14 < *psVar20);
              }
              alignedFree(pVVar3);
              *psVar20 = sVar19;
              pvVar18->size_alloced = uVar13;
              sVar19 = *psVar20;
            }
          }
          pVVar3 = pvVar18->items;
          *psVar20 = sVar19 + 1;
          *(undefined8 *)&pVVar3[sVar19].field_0 = 0;
          *(undefined8 *)((long)&pVVar3[sVar19].field_0 + 8) = 0;
          pvVar18 = (mesh->ptr->normals).
                    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          sVar19 = pvVar18->size_active;
          uVar14 = ((mesh->ptr->positions).
                    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->size_active;
        } while (sVar19 < uVar14);
        uVar12 = i->vn;
      }
      if ((ulong)uVar12 < (this->vn).size_active) {
        pVVar8 = pvVar18->items;
        pVVar3 = (this->vn).items + uVar12;
        uVar6 = *(undefined8 *)((long)&pVVar3->field_0 + 8);
        *(undefined8 *)&pVVar8[uVar14 - 1].field_0 = *(undefined8 *)&pVVar3->field_0;
        *(undefined8 *)((long)&pVVar8[uVar14 - 1].field_0 + 8) = uVar6;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"WARNING: corrupted OBJ file",0x1b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
        std::ostream::put(-0x38);
        std::ostream::flush();
      }
    }
    uVar12 = i->vt;
    if (uVar12 != 0xffffffff) {
      pTVar4 = mesh->ptr;
      pVVar10 = (pTVar4->texcoords).
                super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar14 = ((pTVar4->positions).
                super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->size_active;
      if ((ulong)((long)(pTVar4->texcoords).
                        super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10 >> 3) < uVar14) {
        do {
          local_50 = (anon_union_8_2_4062524c_for_Vec2<float>_1)0x0;
          std::vector<embree::Vec2<float>,std::allocator<embree::Vec2<float>>>::
          emplace_back<embree::Vec2<float>>
                    ((vector<embree::Vec2<float>,std::allocator<embree::Vec2<float>>> *)
                     &pTVar4->texcoords,(Vec2<float> *)&local_50.field_0);
          pTVar4 = mesh->ptr;
          pVVar10 = (pTVar4->texcoords).
                    super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar14 = ((pTVar4->positions).
                    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->size_active;
        } while ((ulong)((long)(pTVar4->texcoords).
                               super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10 >> 3) <
                 uVar14);
        uVar12 = i->vt;
      }
      uVar13 = (ulong)uVar12;
      pVVar5 = (this->vt).
               super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (uVar13 < (ulong)((long)(this->vt).
                                 super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 3)) {
        pVVar10[uVar14 - 1].field_0.field_0.x = pVVar5[uVar13].field_0.field_0.x;
        pVVar10[uVar14 - 1].field_0.field_0.y = pVVar5[uVar13].field_0.field_0.y;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"WARNING: corrupted OBJ file",0x1b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
        std::ostream::put(-0x38);
        std::ostream::flush();
      }
    }
    uVar15 = (int)((mesh->ptr->positions).
                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->size_active - 1;
    pmVar11 = std::
              map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
              ::operator[](vertexMap,i);
    *pmVar11 = uVar15;
  }
  else {
    uVar15 = *(uint32_t *)((long)&iVar7._M_node[1]._M_parent + 4);
  }
  return uVar15;
}

Assistant:

uint32_t OBJLoader::getVertex(std::map<Vertex,uint32_t>& vertexMap, Ref<SceneGraph::TriangleMeshNode> mesh, const Vertex& i)
  {
    const std::map<Vertex, uint32_t>::iterator& entry = vertexMap.find(i);
    if (entry != vertexMap.end()) return(entry->second);
    
    if (i.v >= v.size()) std::cout << "WARNING: corrupted OBJ file" << std::endl;
    else mesh->positions[0].push_back(v[i.v]);
      
    if (i.vn != -1) {
      while (mesh->normals[0].size() < mesh->positions[0].size()) mesh->normals[0].push_back(zero); // some vertices might not had a normal

      if (i.vn >= vn.size()) std::cout << "WARNING: corrupted OBJ file" << std::endl;
      else mesh->normals[0][mesh->positions[0].size()-1] = vn[i.vn];
    }
    if (i.vt != -1) {
      while (mesh->texcoords.size() < mesh->positions[0].size()) mesh->texcoords.push_back(zero); // some vertices might not had a texture coordinate

      if (i.vt >= vt.size()) std::cout << "WARNING: corrupted OBJ file" << std::endl;
      else mesh->texcoords[mesh->positions[0].size()-1] = vt[i.vt];
    }
    return (vertexMap[i] = (unsigned int)(mesh->positions[0].size()) - 1);
  }